

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall PSEngine::undo(PSEngine *this)

{
  size_type sVar1;
  reference pvVar2;
  allocator<char> local_69;
  string local_68;
  Operation local_48;
  PSEngine *local_18;
  PSEngine *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"",&local_69);
  Operation::Operation(&local_48,Undo,None,-1,&local_68);
  std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
            (&this->m_operation_history,&local_48);
  Operation::~Operation(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  sVar1 = std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::size
                    (&this->m_level_state_stack);
  if (sVar1 != 0) {
    pvVar2 = std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::back
                       (&this->m_level_state_stack);
    Level::operator=(&this->m_current_level,pvVar2);
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::pop_back
              (&this->m_level_state_stack);
  }
  return sVar1 != 0;
}

Assistant:

bool PSEngine::undo()
{
    m_operation_history.push_back(Operation(OperationType::Undo));

    if(m_level_state_stack.size() == 0)
    {
        return false;
    }

    m_current_level = m_level_state_stack.back();
    m_level_state_stack.pop_back();

    return true; //todo ? shouln't we return deltas for undos ?
}